

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iReParser.cpp
# Opt level: O0

double __thiscall iReParser::brackets(iReParser *this)

{
  bool bVar1;
  double local_18;
  double result;
  iReParser *this_local;
  
  bVar1 = std::operator==(&this->_token,"(");
  if (bVar1) {
    nextToken(this);
    local_18 = add_sub(this);
    bVar1 = std::operator!=(&this->_token,")");
    if (bVar1) {
      handleErr(this,1);
    }
    nextToken(this);
  }
  else {
    local_18 = atom(this);
  }
  return local_18;
}

Assistant:

double iReParser::brackets()
{
    double result;
    if(_token == "(") {
        nextToken();
        result = add_sub();
        if(_token != ")")
            handleErr(NOMATCH);
        nextToken();
    }
    else result = atom();
    return result;
}